

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O0

void __thiscall
wasm::Instrumenter::Instrumenter(Instrumenter *this,InstrumenterConfig *config,uint64_t moduleHash)

{
  uint64_t moduleHash_local;
  InstrumenterConfig *config_local;
  Instrumenter *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Instrumenter_001b3cc8;
  this->wasm = (Module *)0x0;
  this->config = config;
  this->moduleHash = moduleHash;
  Name::Name(&this->counterGlobal);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&this->functionGlobals);
  Name::Name(&this->secondaryMemory);
  return;
}

Assistant:

Instrumenter::Instrumenter(const InstrumenterConfig& config,
                           uint64_t moduleHash)
  : config(config), moduleHash(moduleHash) {}